

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

virtual_column_map_t *
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileGetVirtualColumns
          (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *__return_storage_ptr__,ClientContext *context,long param_3)

{
  long lVar1;
  MultiFileBindData *pMVar2;
  long local_20;
  
  local_20 = param_3;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionData,_true> *)&local_20);
  lVar1 = local_20;
  __return_storage_ptr__->_M_buckets = &__return_storage_ptr__->_M_single_bucket;
  __return_storage_ptr__->_M_bucket_count = 1;
  (__return_storage_ptr__->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
  __return_storage_ptr__->_M_element_count = 0;
  (__return_storage_ptr__->_M_rehash_policy)._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_rehash_policy)._M_next_resize = 0;
  __return_storage_ptr__->_M_single_bucket = (__node_base_ptr)0x0;
  pMVar2 = (MultiFileBindData *)(local_20 + 0x58);
  duckdb::MultiFileReader::GetVirtualColumns
            (context,(MultiFileReaderBindData *)pMVar2,(unordered_map *)__return_storage_ptr__);
  ParquetMultiFileInfo::GetVirtualColumns
            (context,pMVar2,(virtual_column_map_t *)__return_storage_ptr__);
  if ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)(lVar1 + 0x160) != __return_storage_ptr__) {
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(lVar1 + 0x160),__return_storage_ptr__);
  }
  return (virtual_column_map_t *)__return_storage_ptr__;
}

Assistant:

static virtual_column_map_t MultiFileGetVirtualColumns(ClientContext &context,
	                                                       optional_ptr<FunctionData> bind_data_p) {
		auto &bind_data = bind_data_p->Cast<MultiFileBindData>();
		virtual_column_map_t result;
		MultiFileReader::GetVirtualColumns(context, bind_data.reader_bind, result);

		OP::GetVirtualColumns(context, bind_data, result);

		bind_data.virtual_columns = result;
		return result;
	}